

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiak.c
# Opt level: O3

int adiak_cmdline(void)

{
  char *pcVar1;
  int iVar2;
  long lVar3;
  undefined8 *__ptr;
  uint uVar4;
  long lVar5;
  int arglist_size;
  char *arglist;
  int local_2c;
  char *local_28;
  
  local_28 = (char *)0x0;
  iVar2 = adksys_get_cmdline_buffer(&local_28,&local_2c);
  pcVar1 = local_28;
  uVar4 = 0;
  if (iVar2 == -1) {
    iVar2 = -1;
    __ptr = (undefined8 *)0x0;
  }
  else {
    lVar5 = (long)local_2c;
    if (0 < lVar5) {
      lVar3 = 0;
      uVar4 = 0;
      do {
        uVar4 = uVar4 + (local_28[lVar3] == '\0');
        lVar3 = lVar3 + 1;
      } while (lVar5 != lVar3);
    }
    __ptr = (undefined8 *)malloc((long)(int)uVar4 * 8 + 8);
    *__ptr = pcVar1;
    if (0 < local_2c) {
      iVar2 = 1;
      do {
        if (*pcVar1 == '\0') {
          lVar3 = (long)iVar2;
          iVar2 = iVar2 + 1;
          __ptr[lVar3] = pcVar1 + 1;
        }
        lVar5 = lVar5 + -1;
        pcVar1 = pcVar1 + 1;
      } while (lVar5 != 0);
    }
    iVar2 = adiak_namevalue("cmdline",2,"runinfo","[%s]",__ptr,(ulong)uVar4);
    iVar2 = -(uint)(iVar2 == -1);
  }
  if (local_28 != (char *)0x0) {
    free(local_28);
  }
  if (__ptr != (undefined8 *)0x0) {
    free(__ptr);
  }
  return iVar2;
}

Assistant:

int adiak_cmdline()
{
   int result;
   char *arglist = NULL;
   int  arglist_size, i, j = 0;
   char **myargv = NULL;
   int myargc = 0;
   int retval = -1;

   result = adksys_get_cmdline_buffer(&arglist, &arglist_size);
   if (result == -1)
      goto error;

   for (i = 0; i < arglist_size; i++) {
      if (arglist[i] == '\0')
         myargc++;
   }

   myargv = (char **) malloc(sizeof(char *) * (myargc+1));
   myargv[j++] = arglist;
   for (i = 0; i < arglist_size; i++) {
      if (arglist[i] == '\0')
         myargv[j++] = arglist + i + 1;
   }

   result = adiak_namevalue("cmdline", adiak_general, "runinfo", "[%s]", myargv, myargc);
   if (result == -1)
      goto error;

   retval = 0;
  error:
   if (arglist)
      free(arglist);
   if (myargv)
      free(myargv);
   return retval;
}